

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ilu_ssnode_dfs.c
# Opt level: O1

int ilu_ssnode_dfs(int jcol,int kcol,int_t *asub,int_t *xa_begin,int_t *xa_end,int *marker,
                  GlobalLU_t *Glu)

{
  int iVar1;
  int_t iVar2;
  int_t *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int next;
  long lVar7;
  int_t local_70;
  int local_6c;
  int *local_68;
  long local_60;
  int_t *local_58;
  int *local_50;
  int_t *local_48;
  int_t *local_40;
  long local_38;
  
  local_50 = Glu->xsup;
  local_68 = Glu->supno;
  piVar3 = Glu->lsub;
  local_58 = Glu->xlsub;
  local_70 = Glu->nzlmax;
  lVar7 = (long)jcol;
  local_60 = (long)local_68[lVar7];
  iVar4 = local_68[lVar7] + 1;
  local_68[lVar7] = iVar4;
  next = local_58[lVar7];
  if (jcol <= kcol) {
    local_6c = kcol + 1;
    local_48 = xa_begin;
    local_40 = asub;
    do {
      lVar5 = (long)local_48[lVar7];
      local_38 = lVar7;
      if (local_48[lVar7] < xa_end[lVar7]) {
        do {
          iVar1 = asub[lVar5];
          if (marker[iVar1] != kcol) {
            marker[iVar1] = kcol;
            lVar6 = (long)next;
            next = next + 1;
            piVar3[lVar6] = iVar1;
            if (local_70 <= next) {
              iVar2 = sLUMemXpand(jcol,next,LSUB,&local_70,Glu);
              if (iVar2 != 0) {
                return iVar2;
              }
              piVar3 = Glu->lsub;
              asub = local_40;
              lVar7 = local_38;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < xa_end[lVar7]);
      }
      local_68[lVar7] = iVar4;
      lVar7 = lVar7 + 1;
    } while (local_6c != (int)lVar7);
  }
  lVar7 = (long)kcol;
  if (jcol < kcol) {
    lVar5 = (long)jcol;
    do {
      local_58[lVar5 + 1] = next;
      lVar5 = lVar5 + 1;
    } while (lVar7 != lVar5);
  }
  local_50[local_60 + 2] = kcol + 1;
  local_68[lVar7 + 1] = iVar4;
  local_58[lVar7 + 1] = next;
  return 0;
}

Assistant:

int
ilu_ssnode_dfs(
	   const int  jcol,	    /* in - start of the supernode */
	   const int  kcol,	    /* in - end of the supernode */
	   const int_t  *asub,	    /* in */
	   const int_t  *xa_begin,    /* in */
	   const int_t  *xa_end,	    /* in */
	   int	      *marker,	    /* modified */
	   GlobalLU_t *Glu	    /* modified */
	   )
{
    int_t i, k, nextl, mem_error;
    int   nsuper, krow, kmark;
    int   *xsup, *supno;
    int_t *lsub, *xlsub;
    int_t nzlmax;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    nzlmax  = Glu->nzlmax;

    nsuper = ++supno[jcol];	/* Next available supernode number */
    nextl = xlsub[jcol];

    for (i = jcol; i <= kcol; i++)
    {
	/* For each nonzero in A[*,i] */
	for (k = xa_begin[i]; k < xa_end[i]; k++)
	{
	    krow = asub[k];
	    kmark = marker[krow];
	    if ( kmark != kcol )
	    { /* First time visit krow */
		marker[krow] = kcol;
		lsub[nextl++] = krow;
		if ( nextl >= nzlmax )
		{
		    if ( (mem_error = sLUMemXpand(jcol, nextl, LSUB, &nzlmax,
			    Glu)) != 0)
			return (mem_error);
		    lsub = Glu->lsub;
		}
	    }
	}
	supno[i] = nsuper;
    }

    /* Supernode > 1 */
    if ( jcol < kcol )
	for (i = jcol+1; i <= kcol; i++) xlsub[i] = nextl;

    xsup[nsuper+1] = kcol + 1;
    supno[kcol+1]  = nsuper;
    xlsub[kcol+1]  = nextl;

    return 0;
}